

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

char * tvm::runtime::TypeCode2Str(int type_code)

{
  char *pcVar1;
  ostream *this;
  LogMessageFatal LStack_198;
  
  if ((uint)type_code < 0xe) {
    pcVar1 = &DAT_001c9c68 + *(int *)(&DAT_001c9c68 + (ulong)(uint)type_code * 4);
  }
  else {
    dmlc::LogMessageFatal::LogMessageFatal
              (&LStack_198,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/tvm/include/tvm/runtime/packed_func.h"
               ,0x3f6);
    this = std::operator<<((ostream *)&LStack_198,"unknown type_code=");
    std::ostream::operator<<(this,type_code);
    dmlc::LogMessageFatal::~LogMessageFatal(&LStack_198);
    pcVar1 = "";
  }
  return pcVar1;
}

Assistant:

inline const char* TypeCode2Str(int type_code) {
  switch (type_code) {
    case kDLInt: return "int";
    case kDLUInt: return "uint";
    case kDLFloat: return "float";
    case kTVMStr: return "str";
    case kTVMBytes: return "bytes";
    case kTVMOpaqueHandle: return "handle";
    case kTVMNullptr: return "NULL";
    case kTVMDLTensorHandle: return "ArrayHandle";
    case kTVMDataType: return "DLDataType";
    case kTVMContext: return "TVMContext";
    case kTVMPackedFuncHandle: return "FunctionHandle";
    case kTVMModuleHandle: return "ModuleHandle";
    case kTVMNDArrayHandle: return "NDArrayContainer";
    case kTVMObjectHandle: return "Object";
    default: LOG(FATAL) << "unknown type_code="
                        << static_cast<int>(type_code); return "";
  }
}